

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::~SharedCodeGenerator
          (SharedCodeGenerator *this)

{
  Options::~Options(&this->options_);
  internal::scoped_ptr<google::protobuf::compiler::java::ClassNameResolver>::~scoped_ptr
            (&this->name_resolver_);
  return;
}

Assistant:

SharedCodeGenerator::~SharedCodeGenerator() {
}